

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O1

void json_value_free_ex(json_settings *settings,json_value *value)

{
  json_type jVar1;
  uint uVar2;
  _json_value *p_Var3;
  
  if (value != (json_value *)0x0) {
    value->parent = (_json_value *)0x0;
    do {
      jVar1 = value->type;
      if (jVar1 == json_object) {
        if ((value->u).boolean == 0) goto LAB_00105551;
        uVar2 = (value->u).boolean - 1;
        (value->u).string.length = uVar2;
        p_Var3 = (value->u).object.values[uVar2].value;
      }
      else {
        if (jVar1 == json_string) {
LAB_00105551:
          (*settings->mem_free)((value->u).string.ptr,settings->user_data);
        }
        else if (jVar1 == json_array) {
          if ((value->u).boolean != 0) {
            uVar2 = (value->u).boolean - 1;
            (value->u).string.length = uVar2;
            p_Var3 = *(_json_value **)((value->u).string.ptr + (ulong)uVar2 * 8);
            goto LAB_0010556c;
          }
          goto LAB_00105551;
        }
        p_Var3 = value->parent;
        (*settings->mem_free)(value,settings->user_data);
      }
LAB_0010556c:
      value = p_Var3;
    } while (p_Var3 != (_json_value *)0x0);
  }
  return;
}

Assistant:

void json_value_free_ex (json_settings * settings, json_value * value)
{
   json_value * cur_value;

   if (!value)
      return;

   value->parent = 0;

   while (value)
   {
      switch (value->type)
      {
         case json_array:

            if (!value->u.array.length)
            {
               settings->mem_free (value->u.array.values, settings->user_data);
               break;
            }

            value = value->u.array.values [-- value->u.array.length];
            continue;

         case json_object:

            if (!value->u.object.length)
            {
               settings->mem_free (value->u.object.values, settings->user_data);
               break;
            }

            value = value->u.object.values [-- value->u.object.length].value;
            continue;

         case json_string:

            settings->mem_free (value->u.string.ptr, settings->user_data);
            break;

         default:
            break;
      };

      cur_value = value;
      value = value->parent;
      settings->mem_free (cur_value, settings->user_data);
   }
}